

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Serialize.cpp
# Opt level: O0

void __thiscall chatra::Reader::Reader(Reader *this,RuntimeImp *runtime)

{
  PointerInfo local_28;
  RuntimeImp *local_18;
  RuntimeImp *runtime_local;
  Reader *this_local;
  
  this->runtime = runtime;
  this->buffer = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x0;
  this->offset = 0;
  local_18 = runtime;
  runtime_local = (RuntimeImp *)this;
  std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
  ::unordered_map(&this->chunks);
  std::vector<chatra::Reader::PointerInfo,_std::allocator<chatra::Reader::PointerInfo>_>::vector
            (&this->pointerList);
  this->entityMapEnabled = false;
  std::vector<const_chatra::Class_*,_std::allocator<const_chatra::Class_*>_>::vector
            (&this->classMap);
  std::
  unordered_map<long,_const_chatra::Node_*,_std::hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_const_chatra::Node_*>_>_>
  ::unordered_map(&this->rootMap);
  std::
  unordered_map<chatra::Node_*,_const_chatra::Class_*,_std::hash<chatra::Node_*>,_std::equal_to<chatra::Node_*>,_std::allocator<std::pair<chatra::Node_*const,_const_chatra::Class_*>_>_>
  ::unordered_map(&this->nodeClassMap);
  std::
  unordered_map<chatra::Node_*,_const_chatra::Method_*,_std::hash<chatra::Node_*>,_std::equal_to<chatra::Node_*>,_std::allocator<std::pair<chatra::Node_*const,_const_chatra::Method_*>_>_>
  ::unordered_map(&this->nodeMethodMap);
  std::
  unordered_map<chatra::Node_*,_const_chatra::MethodTable_*,_std::hash<chatra::Node_*>,_std::equal_to<chatra::Node_*>,_std::allocator<std::pair<chatra::Node_*const,_const_chatra::MethodTable_*>_>_>
  ::unordered_map(&this->nodeMethodTableMap);
  local_28.mode = Raw;
  local_28.raw = (void *)0x0;
  std::vector<chatra::Reader::PointerInfo,_std::allocator<chatra::Reader::PointerInfo>_>::
  emplace_back<chatra::Reader::PointerInfo>(&this->pointerList,&local_28);
  return;
}

Assistant:

Reader::Reader(RuntimeImp& runtime) noexcept : runtime(runtime) {
#ifdef CHATRA_NDEBUG
	pointerList.emplace_back(PointerInfo{PointerMode::Raw, nullptr});
#else
	pointerList.emplace_back(PointerInfo{PointerMode::Raw, nullptr, static_cast<PointerType>(0)});
#endif
}